

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O3

int noise_segment_mix(mixed_segment *segment)

{
  float fVar1;
  undefined8 *puVar2;
  code *pcVar3;
  uint32_t size;
  ulong uVar4;
  float fVar5;
  uint32_t samples;
  float *out;
  uint32_t local_24;
  float *local_20;
  
  puVar2 = (undefined8 *)segment->data;
  pcVar3 = (code *)puVar2[1];
  fVar1 = *(float *)(puVar2 + 2);
  local_24 = 0xffffffff;
  mixed_buffer_request_write(&local_20,&local_24,(mixed_buffer *)*puVar2);
  if (local_24 == 0) {
    size = 0;
  }
  else {
    uVar4 = 0;
    do {
      fVar5 = (float)(*pcVar3)(puVar2);
      local_20[uVar4] = fVar5 * fVar1;
      uVar4 = uVar4 + 1;
      size = local_24;
    } while (uVar4 < local_24);
  }
  mixed_buffer_finish_write(size,(mixed_buffer *)*puVar2);
  return 1;
}

Assistant:

int noise_segment_mix(struct mixed_segment *segment){
  struct noise_segment_data *data = (struct noise_segment_data *)segment->data;

  float (*noise)(struct noise_segment_data *data) = data->type;
  float volume = data->volume;
  float *restrict out;
  uint32_t samples = UINT32_MAX;
  mixed_buffer_request_write(&out, &samples, data->out);
  for(uint32_t i=0; i<samples; ++i){
    out[i] = noise(data) * volume;
  }
  mixed_buffer_finish_write(samples, data->out);
  return 1;
}